

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input-xkb.c
# Opt level: O0

void wpe_input_xkb_context_get_entries_for_key_code
               (wpe_input_xkb_context *xkb_context,uint32_t key,wpe_input_xkb_keymap_entry **entries
               ,uint32_t *n_entries)

{
  int iVar1;
  xkb_layout_index_t *pxVar2;
  wpe_input_xkb_keymap_entry *entry;
  int sym;
  int num_syms;
  xkb_keysym_t *syms;
  uint local_58;
  xkb_level_index_t level;
  xkb_level_index_t num_levels;
  xkb_layout_index_t layout;
  xkb_layout_index_t num_layouts;
  xkb_keycode_t key_code;
  xkb_keycode_t max_key_code;
  xkb_keycode_t min_key_code;
  xkb_keymap *keymap;
  uint array_size;
  uint array_allocated_size;
  wpe_input_xkb_keymap_entry *array;
  uint32_t *n_entries_local;
  wpe_input_xkb_keymap_entry **entries_local;
  wpe_input_xkb_context *pwStack_10;
  uint32_t key_local;
  wpe_input_xkb_context *xkb_context_local;
  
  array = (wpe_input_xkb_keymap_entry *)n_entries;
  n_entries_local = (uint32_t *)entries;
  entries_local._4_4_ = key;
  pwStack_10 = xkb_context;
  wpe_input_xkb_context_try_ensure_keymap(xkb_context);
  if (pwStack_10->state == (xkb_state *)0x0) {
    n_entries_local[0] = 0;
    n_entries_local[1] = 0;
    array->hardware_key_code = 0;
  }
  else {
    _array_size = (void *)0x0;
    keymap._4_4_ = 0;
    keymap._0_4_ = 0;
    _max_key_code = xkb_state_get_keymap(pwStack_10->state);
    key_code = xkb_keymap_min_keycode(_max_key_code);
    num_layouts = xkb_keymap_max_keycode(_max_key_code);
    for (layout = key_code; layout < num_layouts; layout = layout + 1) {
      num_levels = xkb_keymap_num_layouts_for_key(_max_key_code,layout);
      for (level = 0; level < num_levels; level = level + 1) {
        local_58 = xkb_keymap_num_levels_for_key(_max_key_code,layout,level);
        for (syms._4_4_ = 0; syms._4_4_ < local_58; syms._4_4_ = syms._4_4_ + 1) {
          iVar1 = xkb_keymap_key_get_syms_by_level(_max_key_code,layout,level,syms._4_4_,&sym);
          for (entry._0_4_ = 0; (int)entry < iVar1; entry._0_4_ = (int)entry + 1) {
            if (*(uint32_t *)(_sym + (long)(int)entry * 4) == entries_local._4_4_) {
              keymap._0_4_ = (uint)keymap + 1;
              if (keymap._4_4_ < (uint)keymap) {
                keymap._4_4_ = keymap._4_4_ + 4;
                _array_size = wpe_realloc_impl(_array_size,(ulong)keymap._4_4_ * 0xc,
                                               "/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/input-xkb.c"
                                               ,0xef);
              }
              pxVar2 = (xkb_layout_index_t *)((long)_array_size + (ulong)((uint)keymap - 1) * 0xc);
              *pxVar2 = layout;
              pxVar2[1] = level;
              pxVar2[2] = syms._4_4_;
            }
          }
        }
      }
    }
    *(void **)n_entries_local = _array_size;
    array->hardware_key_code = (uint)keymap;
  }
  return;
}

Assistant:

void
wpe_input_xkb_context_get_entries_for_key_code(struct wpe_input_xkb_context* xkb_context, uint32_t key, struct wpe_input_xkb_keymap_entry** entries, uint32_t* n_entries)
{
    wpe_input_xkb_context_try_ensure_keymap(xkb_context);
    if (!xkb_context->state) {
        *entries = NULL;
        *n_entries = 0;

        return;
    }

    struct wpe_input_xkb_keymap_entry* array = NULL;
    unsigned array_allocated_size = 0;
    unsigned array_size = 0;

    struct xkb_keymap* keymap = xkb_state_get_keymap(xkb_context->state);
    xkb_keycode_t min_key_code = xkb_keymap_min_keycode(keymap);
    xkb_keycode_t max_key_code = xkb_keymap_max_keycode(keymap);
    xkb_keycode_t key_code;

    for (key_code = min_key_code; key_code < max_key_code; key_code++) {
        xkb_layout_index_t num_layouts = xkb_keymap_num_layouts_for_key(keymap, key_code);
        xkb_layout_index_t layout;

        for (layout = 0; layout < num_layouts; layout++) {
            xkb_level_index_t num_levels = xkb_keymap_num_levels_for_key(keymap, key_code, layout);
            xkb_level_index_t level;

            for (level = 0; level < num_levels; level++) {
                const xkb_keysym_t *syms;
                int num_syms = xkb_keymap_key_get_syms_by_level(keymap, key_code, layout, level, &syms);
                int sym;

                for (sym = 0; sym < num_syms; sym++) {
                    if (syms[sym] == key) {
                        if (++array_size > array_allocated_size) {
                            array_allocated_size += 4;
                            array =
                                wpe_realloc(array, array_allocated_size * sizeof(struct wpe_input_xkb_keymap_entry));
                        }
                        struct wpe_input_xkb_keymap_entry* entry = &array[array_size - 1];

                        entry->hardware_key_code = key_code;
                        entry->layout = layout;
                        entry->level = level;
                    }
                }
            }
        }
    }

    *entries = array;
    *n_entries = array_size;
}